

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O3

void __thiscall Sort::selection_sort(Sort *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar7;
  
  piVar3 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar4) {
    uVar5 = (long)piVar4 - (long)piVar3 >> 2;
    piVar8 = piVar3;
    do {
      uVar7 = (ulong)((long)piVar8 - (long)piVar3) >> 2;
      uVar6 = (uint)uVar7;
      iVar1 = *piVar8;
      uVar10 = (ulong)(iVar1 + 1);
      if (uVar10 < uVar5) {
        uVar9 = iVar1 + 2;
        do {
          uVar7 = uVar7 & 0xffffffff;
          if (uVar5 <= uVar7) goto LAB_00103e19;
          if (piVar3[uVar10] < piVar3[uVar7]) {
            uVar7 = (ulong)(uVar9 - 1);
          }
          uVar6 = (uint)uVar7;
          uVar10 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar10 < uVar5);
      }
      uVar7 = (ulong)uVar6;
      if (uVar5 <= uVar7) {
LAB_00103e19:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      iVar2 = piVar3[uVar7];
      piVar3[uVar7] = iVar1;
      *piVar8 = iVar2;
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar4);
  }
  printArray(this);
  return;
}

Assistant:

void Sort::selection_sort()
{
    for (const auto& i : data_){
        unsigned int min_idx = &i - &data_.at(0);
        for (unsigned j = i+1; j < data_.size(); ++j)
          if (data_.at(j) < data_.at(min_idx))
            min_idx = j;
        std::swap(data_.at(min_idx), const_cast<int&>(i));
    }
    printArray();
}